

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_real_equal_integer_literal(void)

{
  undefined1 local_61d;
  uint local_61c;
  basic_variable<std::allocator<char>_> local_618;
  undefined1 local_5df [2];
  undefined1 local_5dd;
  uint local_5dc;
  basic_variable<std::allocator<char>_> local_5d8;
  undefined1 local_59f [2];
  undefined1 local_59d;
  uint local_59c;
  basic_variable<std::allocator<char>_> local_598;
  undefined1 local_55f [2];
  undefined1 local_55d;
  uint local_55c;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_51f [2];
  undefined1 local_51d;
  int local_51c;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4df [2];
  undefined1 local_4dd;
  int local_4dc;
  basic_variable<std::allocator<char>_> local_4d8;
  undefined1 local_49f [2];
  undefined1 local_49d;
  int local_49c;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_45f [2];
  undefined1 local_45d;
  int local_45c;
  basic_variable<std::allocator<char>_> local_458;
  undefined1 local_41f [2];
  undefined1 local_41d;
  uint local_41c;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3df [2];
  undefined1 local_3dd;
  uint local_3dc;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39f [2];
  undefined1 local_39d;
  uint local_39c;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35f [2];
  undefined1 local_35d;
  uint local_35c;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31f [2];
  undefined1 local_31d;
  int local_31c;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2df [2];
  undefined1 local_2dd;
  int local_2dc;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29f [2];
  undefined1 local_29d;
  int local_29c;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25f [2];
  undefined1 local_25d;
  int local_25c;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21f [2];
  undefined1 local_21d;
  uint local_21c;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1df [2];
  undefined1 local_1dd;
  uint local_1dc;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19f [2];
  undefined1 local_19d;
  uint local_19c;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15f [2];
  undefined1 local_15d;
  uint local_15c;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11f [2];
  undefined1 local_11d;
  int local_11c;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_df [2];
  undefined1 local_dd;
  int local_dc;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9f [2];
  undefined1 local_9d;
  int local_9c;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [17];
  undefined1 local_4d;
  int local_4c;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_48,0.0);
  local_4c = 0;
  local_a[0] = trial::dynamic::operator==(&local_48,&local_4c);
  local_4d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x53c,"void equality_suite::compare_real_equal_integer_literal()",local_a,&local_4d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_98,0.0);
  local_9c = 0;
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_9c);
  local_9d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x53d,"void equality_suite::compare_real_equal_integer_literal()",local_5e,&local_9d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_d8,0.0);
  local_dc = 1;
  local_9f[0] = trial::dynamic::operator==(&local_d8,&local_dc);
  local_dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 1","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x53e,"void equality_suite::compare_real_equal_integer_literal()",local_9f,&local_dd);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_118,0.0);
  local_11c = 1;
  local_df[0] = trial::dynamic::operator!=(&local_118,&local_11c);
  local_11d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 1","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x53f,"void equality_suite::compare_real_equal_integer_literal()",local_df,&local_11d)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_158,0.0);
  local_15c = 0;
  local_11f[0] = trial::dynamic::operator==(&local_158,&local_15c);
  local_15d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 0U","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x543,"void equality_suite::compare_real_equal_integer_literal()",local_11f,&local_15d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_198,0.0);
  local_19c = 0;
  local_15f[0] = trial::dynamic::operator!=(&local_198,&local_19c);
  local_19d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 0U","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x544,"void equality_suite::compare_real_equal_integer_literal()",local_15f,&local_19d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_1d8,0.0);
  local_1dc = 1;
  local_19f[0] = trial::dynamic::operator==(&local_1d8,&local_1dc);
  local_1dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == 1U","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x545,"void equality_suite::compare_real_equal_integer_literal()",local_19f,&local_1dd
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_218,0.0);
  local_21c = 1;
  local_1df[0] = trial::dynamic::operator!=(&local_218,&local_21c);
  local_21d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != 1U","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x546,"void equality_suite::compare_real_equal_integer_literal()",local_1df,&local_21d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_258,0.0);
  local_25c = 0;
  local_21f[0] = trial::dynamic::operator==(&local_258,&local_25c);
  local_25d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x54a,"void equality_suite::compare_real_equal_integer_literal()",local_21f,&local_25d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_298,0.0);
  local_29c = 0;
  local_25f[0] = trial::dynamic::operator!=(&local_298,&local_29c);
  local_29d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x54b,"void equality_suite::compare_real_equal_integer_literal()",local_25f,&local_29d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_2d8,0.0);
  local_2dc = 1;
  local_29f[0] = trial::dynamic::operator==(&local_2d8,&local_2dc);
  local_2dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 1","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x54c,"void equality_suite::compare_real_equal_integer_literal()",local_29f,&local_2dd
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_318,0.0);
  local_31c = 1;
  local_2df[0] = trial::dynamic::operator!=(&local_318,&local_31c);
  local_31d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 1","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x54d,"void equality_suite::compare_real_equal_integer_literal()",local_2df,&local_31d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_358,0.0);
  local_35c = 0;
  local_31f[0] = trial::dynamic::operator==(&local_358,&local_35c);
  local_35d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 0U","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x551,"void equality_suite::compare_real_equal_integer_literal()",local_31f,&local_35d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_398,0.0);
  local_39c = 0;
  local_35f[0] = trial::dynamic::operator!=(&local_398,&local_39c);
  local_39d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 0U","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x552,"void equality_suite::compare_real_equal_integer_literal()",local_35f,&local_39d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_3d8,0.0);
  local_3dc = 1;
  local_39f[0] = trial::dynamic::operator==(&local_3d8,&local_3dc);
  local_3dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == 1U","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x553,"void equality_suite::compare_real_equal_integer_literal()",local_39f,&local_3dd
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_418,0.0);
  local_41c = 1;
  local_3df[0] = trial::dynamic::operator!=(&local_418,&local_41c);
  local_41d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != 1U","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x554,"void equality_suite::compare_real_equal_integer_literal()",local_3df,&local_41d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_458,(longdouble)0);
  local_45c = 0;
  local_41f[0] = trial::dynamic::operator==(&local_458,&local_45c);
  local_45d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 0","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x558,"void equality_suite::compare_real_equal_integer_literal()",local_41f,&local_45d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_498,(longdouble)0);
  local_49c = 0;
  local_45f[0] = trial::dynamic::operator!=(&local_498,&local_49c);
  local_49d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 0","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x559,"void equality_suite::compare_real_equal_integer_literal()",local_45f,&local_49d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_4d8,(longdouble)0);
  local_4dc = 1;
  local_49f[0] = trial::dynamic::operator==(&local_4d8,&local_4dc);
  local_4dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 1","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x55a,"void equality_suite::compare_real_equal_integer_literal()",local_49f,&local_4dd
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_518,(longdouble)0);
  local_51c = 1;
  local_4df[0] = trial::dynamic::operator!=(&local_518,&local_51c);
  local_51d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 1","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x55b,"void equality_suite::compare_real_equal_integer_literal()",local_4df,&local_51d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_558,(longdouble)0);
  local_55c = 0;
  local_51f[0] = trial::dynamic::operator==(&local_558,&local_55c);
  local_55d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 0U","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x55f,"void equality_suite::compare_real_equal_integer_literal()",local_51f,&local_55d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_598,(longdouble)0);
  local_59c = 0;
  local_55f[0] = trial::dynamic::operator!=(&local_598,&local_59c);
  local_59d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 0U","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x560,"void equality_suite::compare_real_equal_integer_literal()",local_55f,&local_59d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_5d8,(longdouble)0);
  local_5dc = 1;
  local_59f[0] = trial::dynamic::operator==(&local_5d8,&local_5dc);
  local_5dd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == 1U","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x561,"void equality_suite::compare_real_equal_integer_literal()",local_59f,&local_5dd
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_618,(longdouble)0);
  local_61c = 1;
  local_5df[0] = trial::dynamic::operator!=(&local_618,&local_61c);
  local_61d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != 1U","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x562,"void equality_suite::compare_real_equal_integer_literal()",local_5df,&local_61d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_618);
  return;
}

Assistant:

void compare_real_equal_integer_literal()
{
    // float - signed
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 0, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 1, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 1, true);
    }
    // float - unsigned
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 0U, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 0U, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == 1U, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != 1U, true);
    }
    // double - signed
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 0, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 1, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 1, true);
    }
    // double - unsigned
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 0U, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 0U, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == 1U, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != 1U, true);
    }
    // long double - signed
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 0, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 0, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 1, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 1, true);
    }
    // long double - unsigned
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 0U, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 0U, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == 1U, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != 1U, true);
    }
}